

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getSubTypesFirstSort
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this)

{
  bool bVar1;
  size_type __n;
  reference pHVar2;
  reference __args;
  iterator this_00;
  iterator begin;
  iterator __first;
  iterator __last;
  __normal_iterator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_*,_std::vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  in_RCX;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_88;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_70;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_68;
  const_iterator it;
  HeapType type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  undefined1 local_30 [8];
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  graph;
  SubTypes *this_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *sorted;
  
  graph.
  super__Vector_base<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::vector((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
            *)local_30);
  __n = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
  std::
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::reserve((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
             *)local_30,__n);
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(&this->types);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(&this->types);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type), bVar1) {
    pHVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    it.
    super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
               )pHVar2->id;
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::find(&this->typeSubTypes,(key_type *)&it);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::end(&this->typeSubTypes);
    bVar1 = std::__detail::operator!=(&local_68,&local_70);
    if (bVar1) {
      __args = std::__detail::
               _Node_const_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
                            *)&local_68);
      std::
      vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
      ::
      emplace_back<std::pair<wasm::HeapType_const,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>const&>
                ((vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
                  *)local_30,__args);
    }
    else {
      local_88.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_88);
      std::
      vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
      ::emplace_back<wasm::HeapType&,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                ((vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>
                  *)local_30,(HeapType *)&it,&local_88);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_88);
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  this_00 = std::
            vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
            ::begin((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                     *)local_30);
  begin = std::
          vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
          ::end((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                 *)local_30);
  TopologicalSort::
  sortOf<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>*,std::vector<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,std::allocator<std::pair<wasm::HeapType,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>>
            (__return_storage_ptr__,(TopologicalSort *)this_00._M_current,
             (__normal_iterator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_*,_std::vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
              )begin._M_current,in_RCX);
  __first = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                      (__return_storage_ptr__);
  __last = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(__return_storage_ptr__)
  ;
  std::
  reverse<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
              )__first._M_current,
             (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
              )__last._M_current);
  std::
  vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::~vector((vector<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getSubTypesFirstSort() const {
    std::vector<std::pair<HeapType, std::vector<HeapType>>> graph;
    graph.reserve(types.size());
    for (auto type : types) {
      if (auto it = typeSubTypes.find(type); it != typeSubTypes.end()) {
        graph.emplace_back(*it);
      } else {
        graph.emplace_back(type, std::vector<HeapType>{});
      }
    }
    auto sorted = TopologicalSort::sortOf(graph.begin(), graph.end());
    std::reverse(sorted.begin(), sorted.end());
    return sorted;
  }